

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O2

int ncnn::binary_op_2_3_4_20<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  ulong uVar9;
  undefined1 (*pauVar10) [64];
  int iVar11;
  undefined1 (*pauVar12) [64];
  int iVar13;
  long lVar14;
  ulong uVar15;
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  float fVar18;
  undefined4 in_register_0000129c;
  
  uVar1 = b->c;
  iVar11 = b->h * b->w * b->d * b->elempack;
  Mat::create_like(c,b,opt->blob_allocator);
  iVar8 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    iVar8 = 0;
    uVar15 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar15 = 0;
    }
    for (uVar9 = 0; uVar9 != uVar15; uVar9 = uVar9 + 1) {
      auVar16 = vbroadcastss_avx512f(ZEXT416(*a->data));
      pauVar10 = (undefined1 (*) [64])(b->cstep * uVar9 * b->elemsize + (long)b->data);
      pauVar12 = (undefined1 (*) [64])(c->cstep * uVar9 * c->elemsize + (long)c->data);
      for (iVar13 = 0; iVar13 + 0xf < iVar11; iVar13 = iVar13 + 0x10) {
        auVar17 = vmulps_avx512f(auVar16,*pauVar10);
        *pauVar12 = auVar17;
        pauVar10 = pauVar10 + 1;
        pauVar12 = pauVar12 + 1;
      }
      fVar18 = auVar16._0_4_;
      for (; iVar13 + 7 < iVar11; iVar13 = iVar13 + 8) {
        fVar2 = *(float *)(*pauVar10 + 4);
        fVar3 = *(float *)(*pauVar10 + 8);
        fVar4 = *(float *)(*pauVar10 + 0xc);
        fVar5 = *(float *)(*pauVar10 + 0x10);
        fVar6 = *(float *)(*pauVar10 + 0x14);
        fVar7 = *(float *)(*pauVar10 + 0x18);
        *(float *)*pauVar12 = fVar18 * *(float *)*pauVar10;
        *(float *)((long)*pauVar12 + 4) = fVar18 * fVar2;
        *(float *)((long)*pauVar12 + 8) = fVar18 * fVar3;
        *(float *)((long)*pauVar12 + 0xc) = fVar18 * fVar4;
        *(float *)((long)*pauVar12 + 0x10) = fVar18 * fVar5;
        *(float *)((long)*pauVar12 + 0x14) = fVar18 * fVar6;
        *(float *)((long)*pauVar12 + 0x18) = fVar18 * fVar7;
        *(undefined4 *)((long)*pauVar12 + 0x1c) = in_register_0000129c;
        pauVar10 = (undefined1 (*) [64])(*pauVar10 + 0x20);
        pauVar12 = (undefined1 (*) [64])((long)*pauVar12 + 0x20);
      }
      for (; iVar13 + 3 < iVar11; iVar13 = iVar13 + 4) {
        fVar2 = *(float *)(*pauVar10 + 4);
        fVar3 = *(float *)(*pauVar10 + 8);
        fVar4 = *(float *)(*pauVar10 + 0xc);
        in_register_0000129c = 0;
        *(float *)*pauVar12 = fVar18 * *(float *)*pauVar10;
        *(float *)((long)*pauVar12 + 4) = fVar18 * fVar2;
        *(float *)((long)*pauVar12 + 8) = fVar18 * fVar3;
        *(float *)((long)*pauVar12 + 0xc) = fVar18 * fVar4;
        pauVar10 = (undefined1 (*) [64])(*pauVar10 + 0x10);
        pauVar12 = (undefined1 (*) [64])((long)*pauVar12 + 0x10);
      }
      lVar14 = 0;
      for (; iVar13 < iVar11; iVar13 = iVar13 + 1) {
        *(float *)((long)*pauVar12 + lVar14) = fVar18 * *(float *)(*pauVar10 + lVar14);
        lVar14 = lVar14 + 4;
      }
    }
  }
  return iVar8;
}

Assistant:

static int binary_op_2_3_4_20(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = b.w;
    int h = b.h;
    int d = b.d;
    int channels = b.c;
    int elempack = b.elempack;
    int size = w * h * d * elempack;

    // type 2 3 4 20
    c.create_like(b, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float a0 = a[0];
        const float* ptr = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _a0_avx512 = _mm512_set1_ps(a0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_a0_avx512, _p);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _a0_avx = _mm256_set1_ps(a0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_a0_avx, _p);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _a0 = _mm_set1_ps(a0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_a0, _p);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(a0, *ptr);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}